

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O0

uint32_t FAudioCreateReverb9WithCustomAllocatorEXT
                   (FAPO **ppApo,uint32_t Flags,FAudioMallocFunc customMalloc,
                   FAudioFreeFunc customFree,FAudioReallocFunc customRealloc)

{
  FAPOBase *fapo;
  uint8_t *pParameterBlocks;
  FAudioFreeFunc in_RCX;
  FAudioMallocFunc in_RDX;
  undefined8 *in_RDI;
  FAudioReallocFunc in_R8;
  uint8_t *params;
  FAudioFXReverb *result;
  FAudioFXReverbParameters9 fxdefault;
  undefined1 local_5d [53];
  FAudioReallocFunc local_28;
  FAudioFreeFunc local_20;
  FAudioMallocFunc local_18;
  undefined8 *local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  memcpy(local_5d,&DAT_0014a404,0x35);
  fapo = (FAPOBase *)(*local_18)(0x18d0);
  pParameterBlocks = (uint8_t *)(*local_18)(0x9f);
  *(undefined1 *)((long)&fapo[1].base.Release + 4) = 9;
  SDL_memcpy(pParameterBlocks,local_5d,0x35);
  SDL_memcpy(pParameterBlocks + 0x35,local_5d,0x35);
  SDL_memcpy(pParameterBlocks + 0x6a,local_5d,0x35);
  SDL_memcpy(&ReverbProperties,&FAudioFX_CLSID_AudioReverb,0x10);
  CreateFAPOBaseWithCustomAllocatorEXT
            (fapo,&ReverbProperties,pParameterBlocks,0x35,'\0',local_18,local_20,local_28);
  *(undefined2 *)&fapo[1].base.AddRef = 0;
  *(undefined2 *)((long)&fapo[1].base.AddRef + 2) = 0;
  *(undefined4 *)((long)&fapo[1].base.AddRef + 4) = 0;
  SDL_memset(&fapo[1].base.GetRegistrationProperties,0,0x17e0);
  (fapo->base).LockForProcess = FAudioFXReverb_LockForProcess;
  (fapo->base).IsInputFormatSupported = FAudioFXReverb_IsInputFormatSupported;
  (fapo->base).IsOutputFormatSupported = FAudioFXReverb_IsOutputFormatSupported;
  (fapo->base).Initialize = FAudioFXReverb_Initialize;
  (fapo->base).Reset = FAudioFXReverb_Reset;
  (fapo->base).Process = FAudioFXReverb_Process;
  fapo->Destructor = FAudioFXReverb_Free;
  *local_8 = fapo;
  return 0;
}

Assistant:

uint32_t FAudioCreateReverb9WithCustomAllocatorEXT(
	FAPO** ppApo,
	uint32_t Flags,
	FAudioMallocFunc customMalloc,
	FAudioFreeFunc customFree,
	FAudioReallocFunc customRealloc
) {
	const FAudioFXReverbParameters9 fxdefault =
	{
		FAUDIOFX_REVERB_DEFAULT_WET_DRY_MIX,
		FAUDIOFX_REVERB_DEFAULT_REFLECTIONS_DELAY,
		FAUDIOFX_REVERB_DEFAULT_REVERB_DELAY,
		FAUDIOFX_REVERB_DEFAULT_REAR_DELAY, /* FIXME: 7POINT1? */
		FAUDIOFX_REVERB_DEFAULT_7POINT1_SIDE_DELAY,
		FAUDIOFX_REVERB_DEFAULT_POSITION,
		FAUDIOFX_REVERB_DEFAULT_POSITION,
		FAUDIOFX_REVERB_DEFAULT_POSITION_MATRIX,
		FAUDIOFX_REVERB_DEFAULT_POSITION_MATRIX,
		FAUDIOFX_REVERB_DEFAULT_EARLY_DIFFUSION,
		FAUDIOFX_REVERB_DEFAULT_LATE_DIFFUSION,
		FAUDIOFX_REVERB_DEFAULT_LOW_EQ_GAIN,
		FAUDIOFX_REVERB_DEFAULT_LOW_EQ_CUTOFF,
		FAUDIOFX_REVERB_DEFAULT_HIGH_EQ_GAIN,
		FAUDIOFX_REVERB_DEFAULT_HIGH_EQ_CUTOFF,
		FAUDIOFX_REVERB_DEFAULT_ROOM_FILTER_FREQ,
		FAUDIOFX_REVERB_DEFAULT_ROOM_FILTER_MAIN,
		FAUDIOFX_REVERB_DEFAULT_ROOM_FILTER_HF,
		FAUDIOFX_REVERB_DEFAULT_REFLECTIONS_GAIN,
		FAUDIOFX_REVERB_DEFAULT_REVERB_GAIN,
		FAUDIOFX_REVERB_DEFAULT_DECAY_TIME,
		FAUDIOFX_REVERB_DEFAULT_DENSITY,
		FAUDIOFX_REVERB_DEFAULT_ROOM_SIZE
	};

	/* Allocate... */
	FAudioFXReverb *result = (FAudioFXReverb*) customMalloc(sizeof(FAudioFXReverb));
	uint8_t *params = (uint8_t*) customMalloc(
		sizeof(FAudioFXReverbParameters9) * 3
	);
	result->apiVersion = 9;
	#define INITPARAMS(offset) \
		FAudio_memcpy( \
			params + sizeof(FAudioFXReverbParameters9) * offset, \
			&fxdefault, \
			sizeof(FAudioFXReverbParameters9) \
		);
	INITPARAMS(0)
	INITPARAMS(1)
	INITPARAMS(2)
	#undef INITPARAMS

	/* Initialize... */
	FAudio_memcpy(
		&ReverbProperties.clsid,
		&FAudioFX_CLSID_AudioReverb,
		sizeof(FAudioGUID)
	);
	CreateFAPOBaseWithCustomAllocatorEXT(
		&result->base,
		&ReverbProperties,
		params,
		sizeof(FAudioFXReverbParameters9),
		0,
		customMalloc,
		customFree,
		customRealloc
	);

	result->inChannels = 0;
	result->outChannels = 0;
	result->sampleRate = 0;
	FAudio_zero(&result->reverb, sizeof(DspReverb));

	/* Function table... */
	#define ASSIGN_VT(name) \
		result->base.base.name = (name##Func) FAudioFXReverb_##name;
	ASSIGN_VT(LockForProcess);
	ASSIGN_VT(IsInputFormatSupported);
	ASSIGN_VT(IsOutputFormatSupported);
	ASSIGN_VT(Initialize);
	ASSIGN_VT(Reset);
	ASSIGN_VT(Process);
	result->base.Destructor = FAudioFXReverb_Free;
	#undef ASSIGN_VT

	/* Finally. */
	*ppApo = &result->base.base;
	return 0;
}